

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_tests.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  argv_local._0_4_ = argc;
  iutest::InitIrisUnitTest((int *)&argv_local,argv);
  bVar1 = FilterTest("*Test*",RAN,RAN,NOT_RAN,NOT_RAN,RAN,NOT_RAN);
  if (bVar1) {
    bVar1 = FilterTest("-*Test*",NOT_RAN,NOT_RAN,RAN,RAN,NOT_RAN,RAN);
    if (bVar1) {
      bVar1 = FilterTest("Foo.Bar",NOT_RAN,NOT_RAN,RAN,NOT_RAN,NOT_RAN,NOT_RAN);
      if (bVar1) {
        bVar1 = FilterTest("***.Bar",NOT_RAN,NOT_RAN,RAN,NOT_RAN,NOT_RAN,NOT_RAN);
        if (bVar1) {
          bVar1 = FilterTest("???.Ba?",NOT_RAN,NOT_RAN,RAN,RAN,NOT_RAN,NOT_RAN);
          if (bVar1) {
            bVar1 = FilterTest("???.Ba?",NOT_RAN,NOT_RAN,RAN,RAN,NOT_RAN,NOT_RAN);
            if (bVar1) {
              bVar1 = FilterTest("Foo.Ba*-*Test*",NOT_RAN,NOT_RAN,RAN,RAN,NOT_RAN,NOT_RAN);
              if (bVar1) {
                bVar1 = FilterTest("Foo.Ba*:-*Test*",NOT_RAN,NOT_RAN,RAN,RAN,NOT_RAN,NOT_RAN);
                if (bVar1) {
                  bVar1 = FilterTest("-*Test*:*Baz*",NOT_RAN,NOT_RAN,RAN,NOT_RAN,NOT_RAN,RAN);
                  if (bVar1) {
                    bVar1 = FilterTest("Foo.Ba*-*Test*:*Baz*",NOT_RAN,NOT_RAN,RAN,NOT_RAN,NOT_RAN,
                                       NOT_RAN);
                    if (bVar1) {
                      bVar1 = FilterTest("*Baz*:*Qux*",NOT_RAN,NOT_RAN,NOT_RAN,RAN,NOT_RAN,RAN);
                      if (bVar1) {
                        bVar1 = FilterTest(":::*Baz*:::::*Qux*:::",NOT_RAN,NOT_RAN,NOT_RAN,RAN,
                                           NOT_RAN,RAN);
                        if (bVar1) {
                          printf("*** Successful ***\n");
                          argv_local._4_4_ = 0;
                        }
                        else {
                          argv_local._4_4_ = 1;
                        }
                      }
                      else {
                        argv_local._4_4_ = 1;
                      }
                    }
                    else {
                      argv_local._4_4_ = 1;
                    }
                  }
                  else {
                    argv_local._4_4_ = 1;
                  }
                }
                else {
                  argv_local._4_4_ = 1;
                }
              }
              else {
                argv_local._4_4_ = 1;
              }
            }
            else {
              argv_local._4_4_ = 1;
            }
          }
          else {
            argv_local._4_4_ = 1;
          }
        }
        else {
          argv_local._4_4_ = 1;
        }
      }
      else {
        argv_local._4_4_ = 1;
      }
    }
    else {
      argv_local._4_4_ = 1;
    }
  }
  else {
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
#endif
{
    IUTEST_INIT(&argc, argv);

    if( !FilterTest("*Test*"
        , TestHoge::RAN
        , HogeTest::RAN
        , FooBar::NOT_RAN
        , FooBaz::NOT_RAN
        , FooBarTest::RAN
        , FooQux::NOT_RAN
    ) ) {
        return 1;
    }

    if( !FilterTest("-*Test*"
        , TestHoge::NOT_RAN
        , HogeTest::NOT_RAN
        , FooBar::RAN
        , FooBaz::RAN
        , FooBarTest::NOT_RAN
        , FooQux::RAN
    ) ) {
        return 1;
    }

    if( !FilterTest("Foo.Bar"
        , TestHoge::NOT_RAN
        , HogeTest::NOT_RAN
        , FooBar::RAN
        , FooBaz::NOT_RAN
        , FooBarTest::NOT_RAN
        , FooQux::NOT_RAN
    ) ) {
        return 1;
    }

    if( !FilterTest("***.Bar"
        , TestHoge::NOT_RAN
        , HogeTest::NOT_RAN
        , FooBar::RAN
        , FooBaz::NOT_RAN
        , FooBarTest::NOT_RAN
        , FooQux::NOT_RAN
    ) ) {
        return 1;
    }

    if( !FilterTest("???.Ba?"
        , TestHoge::NOT_RAN
        , HogeTest::NOT_RAN
        , FooBar::RAN
        , FooBaz::RAN
        , FooBarTest::NOT_RAN
        , FooQux::NOT_RAN
    ) ) {
        return 1;
    }

    if( !FilterTest("???.Ba?"
        , TestHoge::NOT_RAN
        , HogeTest::NOT_RAN
        , FooBar::RAN
        , FooBaz::RAN
        , FooBarTest::NOT_RAN
        , FooQux::NOT_RAN
    ) ) {
        return 1;
    }

    if( !FilterTest("Foo.Ba*-*Test*"
        , TestHoge::NOT_RAN
        , HogeTest::NOT_RAN
        , FooBar::RAN
        , FooBaz::RAN
        , FooBarTest::NOT_RAN
        , FooQux::NOT_RAN
    ) ) {
        return 1;
    }

    if( !FilterTest("Foo.Ba*:-*Test*"
        , TestHoge::NOT_RAN
        , HogeTest::NOT_RAN
        , FooBar::RAN
        , FooBaz::RAN
        , FooBarTest::NOT_RAN
        , FooQux::NOT_RAN
    ) ) {
        return 1;
    }

    if( !FilterTest("-*Test*:*Baz*"
        , TestHoge::NOT_RAN
        , HogeTest::NOT_RAN
        , FooBar::RAN
        , FooBaz::NOT_RAN
        , FooBarTest::NOT_RAN
        , FooQux::RAN
    ) ) {
        return 1;
    }

    if( !FilterTest("Foo.Ba*-*Test*:*Baz*"
        , TestHoge::NOT_RAN
        , HogeTest::NOT_RAN
        , FooBar::RAN
        , FooBaz::NOT_RAN
        , FooBarTest::NOT_RAN
        , FooQux::NOT_RAN
    ) ) {
        return 1;
    }

    if( !FilterTest("*Baz*:*Qux*"
        , TestHoge::NOT_RAN
        , HogeTest::NOT_RAN
        , FooBar::NOT_RAN
        , FooBaz::RAN
        , FooBarTest::NOT_RAN
        , FooQux::RAN
    ) ) {
        return 1;
    }

    if( !FilterTest(":::*Baz*:::::*Qux*:::"
        , TestHoge::NOT_RAN
        , HogeTest::NOT_RAN
        , FooBar::NOT_RAN
        , FooBaz::RAN
        , FooBarTest::NOT_RAN
        , FooQux::RAN
    ) ) {
        return 1;
    }

    printf("*** Successful ***\n");
    return 0;
}